

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Widget.cpp
# Opt level: O2

void __thiscall gui::Widget::addWidgetUnderMouse(Widget *this,Vector2f *param_1)

{
  Gui *this_00;
  __shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  this_00 = this->gui_;
  if (this_00 != (Gui *)0x0) {
    std::__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Widget,void>
              (local_20,(__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<gui::Widget>);
    Gui::addWidgetUnderMouse(this_00,(shared_ptr<gui::Widget> *)local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  }
  return;
}

Assistant:

void Widget::addWidgetUnderMouse(const sf::Vector2f& /*mouseParent*/) {
    if (gui_ != nullptr) {
        gui_->addWidgetUnderMouse(shared_from_this());
    }
}